

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError AbortStream(PaStream *s)

{
  PaError PVar1;
  undefined8 in_RDI;
  
  PVar1 = RealStop((PaAlsaStream *)s,(int)((ulong)in_RDI >> 0x20));
  return PVar1;
}

Assistant:

static PaError AbortStream( PaStream *s )
{
    PaError result = paNoError;
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /* suppress unused variable warnings */
    (void) stream;
    
    /* IMPLEMENT ME, see portaudio.h for required behavior */

    return result;
}